

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlErrAttributeDup(xmlParserCtxtPtr ctxt,xmlChar *prefix,xmlChar *localname)

{
  xmlChar *str2;
  char *msg;
  
  if (prefix == (xmlChar *)0x0) {
    msg = "Attribute %s redefined\n";
    str2 = (xmlChar *)0x0;
    prefix = localname;
  }
  else {
    msg = "Attribute %s:%s redefined\n";
    str2 = localname;
  }
  xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ATTRIBUTE_REDEFINED,XML_ERR_FATAL,prefix,
             str2,(xmlChar *)0x0,0,msg,prefix);
  return;
}

Assistant:

static void
xmlErrAttributeDup(xmlParserCtxtPtr ctxt, const xmlChar * prefix,
                   const xmlChar * localname)
{
    if (prefix == NULL)
        xmlCtxtErr(ctxt, NULL, XML_FROM_PARSER, XML_ERR_ATTRIBUTE_REDEFINED,
                   XML_ERR_FATAL, localname, NULL, NULL, 0,
                   "Attribute %s redefined\n", localname);
    else
        xmlCtxtErr(ctxt, NULL, XML_FROM_PARSER, XML_ERR_ATTRIBUTE_REDEFINED,
                   XML_ERR_FATAL, prefix, localname, NULL, 0,
                   "Attribute %s:%s redefined\n", prefix, localname);
}